

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O1

QString * __thiscall QFileInfo::fileName(QString *__return_storage_ptr__,QFileInfo *this)

{
  QFileInfoPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1->field_0x1db & 0x40) == 0) {
    _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (pQVar1->fileEngine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
    if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0023b1b9;
      QFileSystemEntry::fileName(__return_storage_ptr__,&pQVar1->fileEntry);
    }
    else {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_0023b1b9:
        __stack_chk_fail();
      }
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl +
                  200))(__return_storage_ptr__,
                        _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,1);
    }
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"";
    QString::fromLatin1(&local_38,(QString *)0x0,ba);
    qVar5 = local_38.d.size;
    pcVar4 = local_38.d.ptr;
    pDVar3 = local_38.d.d;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pcVar4;
    local_38.d.size = 0;
    (__return_storage_ptr__->d).size = qVar5;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0023b1b9;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileInfo::fileName() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    if (!d->fileEngine)
        return d->fileEntry.fileName();
    return d->fileEngine->fileName(QAbstractFileEngine::BaseName);
}